

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

bool __thiscall
SQCompilation::CodegenVisitor::IsGlobalConstant(CodegenVisitor *this,SQObject *name,SQObject *e)

{
  bool bVar1;
  undefined8 *in_RDX;
  SQObject *in_RSI;
  SQObjectPtr *in_RDI;
  SQObjectPtr val;
  SQTable *val_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  SQTable *in_stack_ffffffffffffffb8;
  SQObjectPtr local_40;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 *local_20;
  SQObject *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  ::SQObjectPtr::SQObjectPtr(in_RDI);
  val_00 = ((in_RDI[1].super_SQObject._unVal.pThread)->_sharedstate->_consts).super_SQObject._unVal.
           pTable;
  ::SQObjectPtr::SQObjectPtr(&local_40,local_18);
  bVar1 = SQTable::Get(in_stack_ffffffffffffffb8,
                       (SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (SQObjectPtr *)val_00);
  ::SQObjectPtr::~SQObjectPtr(in_RDI);
  if (bVar1) {
    *local_20 = local_30;
    local_20[1] = local_28;
  }
  local_1 = bVar1;
  ::SQObjectPtr::~SQObjectPtr(in_RDI);
  return (bool)(local_1 & 1);
}

Assistant:

bool CodegenVisitor::IsGlobalConstant(const SQObject &name, SQObject &e)
{
    SQObjectPtr val;
    if (_table(_ss(_vm)->_consts)->Get(name, val)) {
        e = val;
        return true;
    }
    return false;
}